

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::TailoredSet::compareContractions(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  UErrorCode *errorCode;
  UBool UVar1;
  int8_t iVar2;
  UnicodeString *text;
  UnicodeString *pUVar3;
  UnicodeString *this_00;
  UnicodeString none;
  Iterator baseSuffixes;
  Iterator suffixes;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  UChar *local_180;
  UChar *local_170;
  UnicodeString local_160;
  Iterator local_120;
  Iterator local_a8;
  
  errorCode = &this->errorCode;
  local_188.p_ = p;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_188,0,errorCode);
  local_170 = local_188.p_;
  local_190.p_ = q;
  UCharsTrie::Iterator::Iterator(&local_120,&local_190,0,errorCode);
  local_180 = local_190.p_;
  UnicodeString::UnicodeString(&local_160,L'\xffff');
  UnicodeString::append(&local_160,L'\xffff');
  do {
    this_00 = (UnicodeString *)0x0;
    text = (UnicodeString *)0x0;
LAB_002447d2:
    if (this_00 == (UnicodeString *)0x0) {
      UVar1 = UCharsTrie::Iterator::next(&local_a8,errorCode);
      this_00 = &local_160;
      if (UVar1 != '\0') {
        this_00 = &local_a8.str_;
      }
    }
    pUVar3 = text;
    if (text == (UnicodeString *)0x0) {
      UVar1 = UCharsTrie::Iterator::next(&local_120,errorCode);
      text = &local_120.str_;
      pUVar3 = &local_160;
      if (UVar1 == '\0') goto LAB_002447fc;
    }
    else {
LAB_002447fc:
      text = pUVar3;
      if ((this_00 == &local_160) && (pUVar3 == &local_160)) {
        UnicodeString::~UnicodeString(&local_160);
        UCharsTrie::Iterator::~Iterator(&local_120);
        UCharsTrie::Iterator::~Iterator(&local_a8);
        return;
      }
    }
    iVar2 = UnicodeString::compare(this_00,text);
    if (iVar2 < '\0') {
      addSuffix(this,c,this_00);
      this_00 = (UnicodeString *)0x0;
      goto LAB_002447d2;
    }
    if (iVar2 != '\0') {
      addSuffix(this,c,text);
      text = (UnicodeString *)0x0;
      goto LAB_002447d2;
    }
    this->suffix = this_00;
    compare(this,c,local_a8.value_,local_120.value_);
    this->suffix = (UnicodeString *)0x0;
  } while( true );
}

Assistant:

void
TailoredSet::compareContractions(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over suffixes of both tables.
    UCharsTrie::Iterator suffixes(p, 0, errorCode);
    UCharsTrie::Iterator baseSuffixes(q, 0, errorCode);
    const UnicodeString *ts = NULL;  // Tailoring suffix.
    const UnicodeString *bs = NULL;  // Base suffix.
    // Use a string with two U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in contractions except maybe
    // as a single suffix character for a root-collator boundary contraction.
    UnicodeString none((UChar)0xffff);
    none.append((UChar)0xffff);
    for(;;) {
        if(ts == NULL) {
            if(suffixes.next(errorCode)) {
                ts = &suffixes.getString();
            } else {
                ts = &none;
            }
        }
        if(bs == NULL) {
            if(baseSuffixes.next(errorCode)) {
                bs = &baseSuffixes.getString();
            } else {
                bs = &none;
            }
        }
        if(ts == &none && bs == &none) { break; }
        int32_t cmp = ts->compare(*bs);
        if(cmp < 0) {
            // ts occurs in the tailoring but not in the base.
            addSuffix(c, *ts);
            ts = NULL;
        } else if(cmp > 0) {
            // bs occurs in the base but not in the tailoring.
            addSuffix(c, *bs);
            bs = NULL;
        } else {
            suffix = ts;
            compare(c, (uint32_t)suffixes.getValue(), (uint32_t)baseSuffixes.getValue());
            suffix = NULL;
            ts = NULL;
            bs = NULL;
        }
    }
}